

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToInt64Clamp(JSContext *ctx,int64_t *pres,JSValue val,int64_t min,int64_t max,
                   int64_t neg_offset)

{
  int iVar1;
  
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  iVar1 = JS_ToInt64SatFree(ctx,pres,val);
  if (iVar1 == 0) {
    if (*pres < 0) {
      *pres = *pres + neg_offset;
    }
    if ((*pres < min) || (min = max, max < *pres)) {
      *pres = min;
    }
  }
  return iVar1;
}

Assistant:

int JS_ToInt64Clamp(JSContext *ctx, int64_t *pres, JSValueConst val,
                    int64_t min, int64_t max, int64_t neg_offset)
{
    int res = JS_ToInt64SatFree(ctx, pres, JS_DupValue(ctx, val));
    if (res == 0) {
        if (*pres < 0)
            *pres += neg_offset;
        if (*pres < min)
            *pres = min;
        else if (*pres > max)
            *pres = max;
    }
    return res;
}